

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O1

void setter_thread_body(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  int extraout_EDX;
  uint uVar4;
  ulong uVar5;
  long *plVar6;
  char *pcVar7;
  char *pcVar8;
  char *__s2;
  int *piVar9;
  int iStack_c80;
  char cStack_c7c;
  undefined1 *puStack_b78;
  code *pcStack_b70;
  code *pcStack_b68;
  long lStack_b58;
  undefined1 *puStack_b50;
  char *pcStack_b48;
  undefined1 *puStack_b40;
  undefined1 *puStack_b38;
  undefined8 uStack_b30;
  code *pcStack_b20;
  undefined1 *puStack_b18;
  undefined1 **ppuStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  long alStack_ad8 [17];
  undefined1 auStack_a50 [511];
  undefined1 uStack_851;
  undefined1 auStack_850 [1024];
  char *pcStack_450;
  char *pcStack_448;
  code *pcStack_440;
  char acStack_438 [512];
  code *pcStack_238;
  char acStack_230 [512];
  undefined8 uStack_30;
  
  uVar5 = 0x32;
  while( true ) {
    uStack_30 = 0x168476;
    iVar1 = uv_set_process_title
                      ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled")
    ;
    if (iVar1 != 0) break;
    uStack_30 = 0x168482;
    iVar1 = uv_set_process_title
                      ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82")
    ;
    if (iVar1 != 0) {
LAB_001684b5:
      uStack_30 = 0x1684ba;
      setter_thread_body_cold_2();
      break;
    }
    uStack_30 = 0x16848e;
    iVar1 = uv_set_process_title
                      ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT")
    ;
    if (iVar1 != 0) {
LAB_001684b0:
      uStack_30 = 0x1684b5;
      setter_thread_body_cold_3();
      goto LAB_001684b5;
    }
    uStack_30 = 0x16849a;
    iVar1 = uv_set_process_title
                      ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU")
    ;
    if (iVar1 != 0) {
      uStack_30 = 0x1684b0;
      setter_thread_body_cold_4();
      goto LAB_001684b0;
    }
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
    if (uVar4 == 0) {
      return;
    }
  }
  uStack_30 = 0x1684bf;
  setter_thread_body_cold_1();
  pcVar8 = acStack_230;
  __s2 = acStack_230;
  pcStack_238 = (code *)0x1684d3;
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  pcStack_238 = (code *)0x1684df;
  set_title("new title");
  pcVar7 = (char *)0x0;
  pcStack_238 = (code *)0x1684eb;
  iVar1 = uv_get_process_title(0,100);
  if (iVar1 == -0x16) {
    pcStack_238 = (code *)0x1684fa;
    iVar1 = uv_get_process_title(acStack_230,0);
    pcVar7 = pcVar8;
    if (iVar1 != -0x16) goto LAB_00168520;
    pcStack_238 = (code *)0x16850c;
    iVar1 = uv_get_process_title(acStack_230,1);
    if (iVar1 == -0x69) {
      return;
    }
  }
  else {
    pcStack_238 = (code *)0x168520;
    run_test_process_title_cold_1();
LAB_00168520:
    __s2 = pcVar7;
    pcStack_238 = (code *)0x168525;
    run_test_process_title_cold_2();
  }
  pcStack_238 = set_title;
  run_test_process_title_cold_3();
  pcStack_238 = (code *)0x18dbcc;
  pcStack_440 = (code *)0x168542;
  iVar1 = uv_get_process_title(acStack_438,0x200);
  if (iVar1 == 0) {
    pcStack_440 = (code *)0x16854e;
    iVar1 = uv_set_process_title(__s2);
    if (iVar1 != 0) goto LAB_00168580;
    pcStack_440 = (code *)0x16855f;
    iVar1 = uv_get_process_title(acStack_438,0x200);
    if (iVar1 != 0) goto LAB_00168585;
    pcStack_440 = (code *)0x16856e;
    iVar1 = strcmp(acStack_438,__s2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_440 = (code *)0x168580;
    set_title_cold_1();
LAB_00168580:
    pcStack_440 = (code *)0x168585;
    set_title_cold_2();
LAB_00168585:
    pcStack_440 = (code *)0x16858a;
    set_title_cold_3();
  }
  pcStack_440 = run_test_process_title_big_argv;
  set_title_cold_4();
  pcStack_448 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
  plVar6 = &lStack_b58;
  lStack_b58 = 0x3ff;
  puVar3 = auStack_850;
  pcStack_b68 = (code *)0x1685b6;
  pcStack_450 = __s2;
  pcStack_440 = (code *)uVar5;
  iVar1 = uv_exepath(puVar3);
  if (iVar1 == 0) {
    uVar5 = 0;
    auStack_850[lStack_b58] = 0;
    pcStack_b68 = (code *)0x1685e7;
    memset(auStack_a50,0x78,0x1ff);
    uStack_851 = 0;
    ppuStack_b10 = &puStack_b50;
    pcStack_b48 = "process_title_big_argv_helper";
    uStack_b30 = 0;
    uStack_b08 = 0;
    uStack_b00 = 0;
    uStack_af8 = 0;
    uStack_af0 = 0;
    uStack_ae8 = 0;
    pcStack_b20 = exit_cb;
    pcStack_b68 = (code *)0x168643;
    puStack_b50 = puVar3;
    puStack_b40 = auStack_a50;
    puStack_b38 = auStack_a50;
    puStack_b18 = puVar3;
    uVar2 = uv_default_loop();
    plVar6 = alStack_ad8;
    pcStack_b68 = (code *)0x168656;
    iVar1 = uv_spawn(uVar2,plVar6,&pcStack_b20);
    if (iVar1 != 0) goto LAB_001686b4;
    pcStack_b68 = (code *)0x16865f;
    uVar2 = uv_default_loop();
    plVar6 = (long *)0x0;
    pcStack_b68 = (code *)0x168669;
    iVar1 = uv_run(uVar2);
    if (iVar1 == 0) {
      pcStack_b68 = (code *)0x168672;
      puVar3 = (undefined1 *)uv_default_loop();
      pcStack_b68 = (code *)0x168686;
      uv_walk(puVar3,close_walk_cb,0);
      plVar6 = (long *)0x0;
      pcStack_b68 = (code *)0x168690;
      uv_run(puVar3);
      pcStack_b68 = (code *)0x168695;
      uVar2 = uv_default_loop();
      pcStack_b68 = (code *)0x16869d;
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001686be;
    }
  }
  else {
    pcStack_b68 = (code *)0x1686b4;
    run_test_process_title_big_argv_cold_1();
LAB_001686b4:
    pcStack_b68 = (code *)0x1686b9;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_b68 = (code *)0x1686be;
  run_test_process_title_big_argv_cold_3();
LAB_001686be:
  pcStack_b68 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  if (plVar6 == (long *)0x0) {
    if (extraout_EDX == 0) {
      uv_close();
      return;
    }
  }
  else {
    pcStack_b70 = (code *)0x1686da;
    exit_cb_cold_1();
  }
  pcStack_b70 = process_title_big_argv;
  exit_cb_cold_2();
  piVar9 = &iStack_c80;
  puStack_b78 = puVar3;
  pcStack_b70 = (code *)uVar5;
  memset(&iStack_c80,0,0x100);
  iStack_c80 = 0x6c696166;
  uv_get_process_title(&iStack_c80,0x100);
  if (cStack_c7c != '\0' || iStack_c80 != 0x6c696166) {
    return;
  }
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(piVar9,0);
  return;
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT(0 == uv_set_process_title(titles[0]));
    ASSERT(0 == uv_set_process_title(titles[1]));
    ASSERT(0 == uv_set_process_title(titles[2]));
    ASSERT(0 == uv_set_process_title(titles[3]));
  }
}